

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::OfHelper
              (bool isTypedArrayEntryPoint,Arguments *args,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  double value;
  bool bVar3;
  bool bVar4;
  Attributes attributes;
  int succeeded;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *function;
  JavascriptArray *this_00;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  TypedArrayBase *pTVar7;
  RecyclableObject *pRVar8;
  uint64 uVar9;
  uint64 uVar10;
  uint32 length;
  uint uVar11;
  uint32 itemIndex;
  uint uVar12;
  uint32 uVar13;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_c8;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction local_a8;
  RecyclableObject *local_88;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  JavascriptArray *local_40;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  uVar11 = SUB84(args->Info,0);
  jsReentLock._24_8_ = scriptContext;
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298a,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar3) goto LAB_00b82f9b;
    *puVar5 = 0;
    uVar11 = SUB84(args->Info,0);
  }
  pvVar6 = Arguments::operator[](args,0);
  bVar3 = JavascriptOperators::IsConstructor(pvVar6);
  uVar11 = uVar11 & 0xffffff;
  length = uVar11 - 1;
  if (bVar3) {
    pvVar6 = Arguments::operator[](args,0);
    function = VarTo<Js::RecyclableObject>(pvVar6);
    pRVar8 = *(RecyclableObject **)(*(long *)(jsReentLock._24_8_ + 8) + 0x30);
    bVar3 = JavascriptLibrary::IsTypedArrayConstructor(function,(ScriptContext *)jsReentLock._24_8_)
    ;
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    this = *(ThreadContext **)(jsReentLock._24_8_ + 0x3b8);
    local_a8.scriptContext = (ScriptContext *)jsReentLock._24_8_;
    local_a8.constructor = function;
    local_a8.len = length;
    local_a8.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
    if (function == pRVar8 || bVar3) {
      bVar3 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      local_40 = (JavascriptArray *)
                 anon_func::anon_class_32_1_2f014396::
                 anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_a8);
      this->reentrancySafeOrHandled = bVar3;
    }
    else {
      local_c8.scriptContext = (ScriptContext *)jsReentLock._24_8_;
      bVar3 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      local_c8.constructor = function;
      local_c8.len = length;
      local_c8.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
      local_88 = pRVar8;
      attributes = FunctionInfo::GetAttributes(function);
      bVar4 = ThreadContext::HasNoSideEffect(this,function,attributes);
      if (bVar4) {
        local_40 = (JavascriptArray *)
                   anon_func::anon_class_32_1_2f014396::
                   anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_c8);
        bVar4 = ThreadContext::IsOnStack(local_40);
LAB_00b82b93:
        if (bVar4 != false) {
          this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((attributes & HasNoSideEffect) != None) {
          local_40 = (JavascriptArray *)
                     anon_func::anon_class_32_1_2f014396::
                     anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_c8);
          bVar4 = ThreadContext::IsOnStack(local_40);
          goto LAB_00b82b93;
        }
        IVar1 = this->implicitCallFlags;
        local_40 = (JavascriptArray *)
                   anon_func::anon_class_32_1_2f014396::
                   anon_class_32_4_7a04c08f_for_newObjectCreationFunction::operator()(&local_c8);
        this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
        local_40 = (JavascriptArray *)
                   (((((((((function->type).ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                    javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      this->reentrancySafeOrHandled = bVar3;
      pRVar8 = local_88;
    }
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
    bVar3 = IsNonES5Array(local_40);
    if ((bVar3) &&
       (this_00 = UnsafeVarTo<Js::JavascriptArray>(local_40), this_00 != (JavascriptArray *)0x0)) {
      bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this_00);
      if ((bVar3) &&
         (this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this_00),
         this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
      }
      JsReentLock::setObjectForMutation((JsReentLock *)local_80,this_00);
      pTVar7 = (TypedArrayBase *)0x0;
    }
    else {
      bVar3 = VarIs<Js::TypedArrayBase>(local_40);
      if (bVar3) {
        pTVar7 = UnsafeVarTo<Js::TypedArrayBase>(local_40);
      }
      else {
        pTVar7 = (TypedArrayBase *)0x0;
      }
      this_00 = (JavascriptArray *)0x0;
    }
    if (local_40 == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      local_88 = pRVar8;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x29c8,"(newObj)","newObj");
      if (!bVar3) goto LAB_00b82f9b;
      *puVar5 = 0;
      if (function == local_88) {
        local_40 = (JavascriptArray *)0x0;
        goto LAB_00b82f4e;
      }
    }
    else if (function == pRVar8) goto LAB_00b82f4e;
    if (pTVar7 == (TypedArrayBase *)0x0) {
      if (length != 0) {
        uVar12 = 1;
        do {
          pvVar6 = Arguments::operator[](args,uVar12);
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pRVar8 = VarTo<Js::RecyclableObject>(local_40);
          succeeded = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x29])(pRVar8,(ulong)(uVar12 - 1),pvVar6,4);
          ThrowErrorOnFailure(succeeded,(ScriptContext *)jsReentLock._24_8_,uVar12 - 1);
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    else if (length != 0) {
      uVar12 = 1;
      do {
        pvVar6 = Arguments::operator[](args,uVar12);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        (*(pTVar7->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(pTVar7,(ulong)(uVar12 - 1),pvVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else {
    if (isTypedArrayEntryPoint) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec40,L"[TypedArray].of");
    }
    this_00 = JavascriptLibrary::CreateArray(*(JavascriptLibrary **)(jsReentLock._24_8_ + 8),length)
    ;
    local_40 = this_00;
    if ((this_00->head).ptr == EmptySegment) {
      AllocateHead<void*>(this_00);
    }
LAB_00b82f4e:
    uVar13 = length;
    itemIndex = 0;
    while (bVar3 = uVar13 != 0, uVar13 = uVar13 - 1, bVar3) {
      pvVar6 = Arguments::operator[](args,itemIndex + 1);
      DirectSetItemAt<void*>(this_00,itemIndex,pvVar6);
      itemIndex = itemIndex + 1;
    }
  }
  if (!isTypedArrayEntryPoint) {
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (uVar11 == 0) {
      value = (double)length;
      uVar9 = NumberUtilities::ToSpecial(value);
      bVar3 = NumberUtilities::IsNan(value);
      if (((bVar3) && (uVar10 = NumberUtilities::ToSpecial(value), uVar10 != 0xfff8000000000000)) &&
         (uVar10 = NumberUtilities::ToSpecial(value), uVar10 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_00b82f9b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pvVar6 = (Var)(uVar9 ^ 0xfffc000000000000);
    }
    else {
      pvVar6 = (Var)((ulong)length | 0x1000000000000);
    }
    JavascriptOperators::OP_SetProperty
              (local_40,0xd1,pvVar6,(ScriptContext *)jsReentLock._24_8_,(PropertyValueInfo *)0x0,
               PropertyOperation_ThrowIfNotExtensible,(Var)0x0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
  }
  ((ThreadContext *)local_80)->noJsReentrancy = (bool)jsReentLock.m_arrayObject2._0_1_;
  return local_40;
}

Assistant:

Var JavascriptArray::OfHelper(bool isTypedArrayEntryPoint, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(args.Info.Count > 0);

        // args.Info.Count cannot equal zero or we would have thrown above so no chance of underflowing
        uint32 len = args.Info.Count - 1;
        Var newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        TypedArrayBase* newTypedArray = nullptr;
        bool isBuiltinArrayCtor = true;

        if (JavascriptOperators::IsConstructor(args[0]))
        {
            RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
            isBuiltinArrayCtor = (constructor == scriptContext->GetLibrary()->GetArrayConstructor());
            bool isBuiltInTypedArrayCtor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);

            JS_REENTRANT
            (
                jsReentLock,
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isBuiltinArrayCtor || isBuiltInTypedArrayCtor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    if (isTypedArrayEntryPoint)
                    {
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                    }
                    else
                    {
                        return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
                    }
                });
            )

            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SETOBJECT_FOR_MUTATION(jsReentLock, newArr);

            }
            else if (VarIs<TypedArrayBase>(newObj))
            {
                newTypedArray = UnsafeVarTo<TypedArrayBase>(newObj);
            }
        }
        else
        {
            // We only throw when the constructor property is not a constructor function in the TypedArray version
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].of"));
            }

            newArr = scriptContext->GetLibrary()->CreateArray(len);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }

        // At least we have a new object of some kind
        Assert(newObj);

        if (isBuiltinArrayCtor)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                newArr->DirectSetItemAt(k, kValue);
            }
        }
        else if (newTypedArray)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, kValue));
            }
        }
        else
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];
                JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(VarTo<RecyclableObject>(newObj), k, kValue), scriptContext, k));
            }
        }

        if (!isTypedArrayEntryPoint)
        {
            // Set length if we are in the Array version of the function
            JS_REENTRANT(jsReentLock, JavascriptOperators::OP_SetProperty(newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(len, scriptContext), scriptContext, nullptr, PropertyOperation_ThrowIfNotExtensible));
        }

        return newObj;
    }